

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_getvarargs(lua_State *L,CallInfo *ci,StkId where,int wanted)

{
  int n;
  long lVar1;
  StkId pSVar2;
  TValue *io2;
  TValue *io1;
  ptrdiff_t t__;
  int local_28;
  int nextra;
  int i;
  int wanted_local;
  StkId where_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  n = (ci->u).l.nextraargs;
  nextra = wanted;
  _i = where;
  if (wanted < 0) {
    if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)n) {
      lVar1 = (L->stack).offset;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      luaD_growstack(L,n,1);
      _i = (StkId)((long)(L->stack).p + ((long)where - lVar1));
    }
    (L->top).p = _i + n;
    nextra = n;
  }
  for (local_28 = 0; local_28 < nextra && local_28 < n; local_28 = local_28 + 1) {
    pSVar2 = (ci->func).p;
    _i[local_28].val.value_ = pSVar2[(long)local_28 - (long)n].val.value_;
    _i[local_28].val.tt_ = *(lu_byte *)((long)(pSVar2 + ((long)local_28 - (long)n)) + 8);
  }
  for (; local_28 < nextra; local_28 = local_28 + 1) {
    (&_i->val)[local_28].tt_ = '\0';
  }
  return;
}

Assistant:

void luaT_getvarargs (lua_State *L, CallInfo *ci, StkId where, int wanted) {
  int i;
  int nextra = ci->u.l.nextraargs;
  if (wanted < 0) {
    wanted = nextra;  /* get all extra arguments available */
    checkstackGCp(L, nextra, where);  /* ensure stack space */
    L->top.p = where + nextra;  /* next instruction will need top */
  }
  for (i = 0; i < wanted && i < nextra; i++)
    setobjs2s(L, where + i, ci->func.p - nextra + i);
  for (; i < wanted; i++)   /* complete required results with nil */
    setnilvalue(s2v(where + i));
}